

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnfMan.c
# Opt level: O0

int Cnf_DataWriteOrClause2(void *p,Cnf_Dat_t *pCnf)

{
  int iVar1;
  lit lVar2;
  lit *begin;
  void *pvVar3;
  int *pLits;
  int i;
  Aig_Obj_t *pObj;
  sat_solver2 *pSat;
  Cnf_Dat_t *pCnf_local;
  void *p_local;
  
  iVar1 = Aig_ManCoNum(pCnf->pMan);
  begin = (lit *)malloc((long)iVar1 << 2);
  for (pLits._4_4_ = 0; iVar1 = Vec_PtrSize(pCnf->pMan->vCos), pLits._4_4_ < iVar1;
      pLits._4_4_ = pLits._4_4_ + 1) {
    pvVar3 = Vec_PtrEntry(pCnf->pMan->vCos,pLits._4_4_);
    lVar2 = toLitCond(pCnf->pVarNums[*(int *)((long)pvVar3 + 0x24)],0);
    begin[pLits._4_4_] = lVar2;
  }
  iVar1 = Aig_ManCoNum(pCnf->pMan);
  iVar1 = sat_solver2_addclause((sat_solver2 *)p,begin,begin + iVar1,0);
  if (iVar1 == 0) {
    if (begin != (lit *)0x0) {
      free(begin);
    }
    p_local._4_4_ = 0;
  }
  else {
    if (begin != (lit *)0x0) {
      free(begin);
    }
    p_local._4_4_ = 1;
  }
  return p_local._4_4_;
}

Assistant:

int Cnf_DataWriteOrClause2( void * p, Cnf_Dat_t * pCnf )
{
    sat_solver2 * pSat = (sat_solver2 *)p;
    Aig_Obj_t * pObj;
    int i, * pLits;
    pLits = ABC_ALLOC( int, Aig_ManCoNum(pCnf->pMan) );
    Aig_ManForEachCo( pCnf->pMan, pObj, i )
        pLits[i] = toLitCond( pCnf->pVarNums[pObj->Id], 0 );
    if ( !sat_solver2_addclause( pSat, pLits, pLits + Aig_ManCoNum(pCnf->pMan), 0 ) )
    {
        ABC_FREE( pLits );
        return 0;
    }
    ABC_FREE( pLits );
    return 1;
}